

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  CommandLine<Catch::ConfigData> *in_RDI;
  undefined1 local_a8 [32];
  undefined1 local_88 [64];
  string local_48;
  undefined1 local_28 [13];
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_RDI);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_RDI,0x68);
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-?",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"-h",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"--help",(allocator *)(local_28 + 0xc));
  Clara::addOptName((Arg *)local_28._0_8_,(string *)local_88);
  std::__cxx11::string::string((string *)local_a8,"display usage information",&local_1b);
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_28,7);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-l",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--list-tests",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"list all/matching test cases",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-t",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--list-tags",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"list all/matching tags",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,1);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-s",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--success",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"include successful tests in output",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,4);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-b",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--break",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"break into debugger on failure",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,5);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-e",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--nothrow",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"skip exception tests",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,6);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-i",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--invisibles",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"show invisibles (tabs, newlines)",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-o",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--out",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"output filename",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"filename",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_28,0x28,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-r",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--reporter",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string
            ((string *)local_88,"reporter to use (defaults to console)",
             (allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"name",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_28,addReporterName,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-n",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--name",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"suite name",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"name",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_28,0x48,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-a",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--abort",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"abort at first failure",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,abortAfterFirst);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-x",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--abortx",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string
            ((string *)local_88,"abort after x failures",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"no. failures",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            ((ArgBuilder *)local_28,abortAfterX,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-w",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--warn",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"enable warnings",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"warning name",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_28,addWarning,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  local_88._0_8_ = Clara::CommandLine<Catch::ConfigData>::operator[]();
  std::__cxx11::string::string
            ((string *)(local_88 + 0x20),"which test or tests to use",(allocator *)local_a8);
  std::__cxx11::string::_M_assign((string *)(local_88._0_8_ + 8));
  std::__cxx11::string::string
            ((string *)&local_48,"test name, pattern or tags",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_88,addTestOrTags,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-d",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--durations",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string
            ((string *)local_88,"show test durations",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"yes|no",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            ((ArgBuilder *)local_28,setShowDurations,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-f",&local_1a);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_28,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--input-file",&local_19);
  Clara::addOptName((Arg *)local_28._0_8_,&local_48);
  std::__cxx11::string::string
            ((string *)local_88,"load test names to run from a file",(allocator *)(local_28 + 0xc));
  std::__cxx11::string::_M_assign((string *)(local_28._0_8_ + 8));
  std::__cxx11::string::string((string *)local_a8,"filename",&local_1b);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_28,loadTestNamesFromFile,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"-#",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"--filenames-as-tags",&local_1a);
  Clara::addOptName((Arg *)local_a8._0_8_,&local_48);
  std::__cxx11::string::string((string *)local_88,"adds a tag for the filename",&local_19);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_a8,9);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string
            ((string *)(local_88 + 0x20),"--list-test-names-only",(allocator *)local_a8);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_88,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)&local_48,"list all/matching test cases names only",(allocator *)local_28);
  std::__cxx11::string::_M_assign((string *)(local_88._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_88,3);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"--list-reporters",(allocator *)local_a8)
  ;
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_88,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"list all reporters",(allocator *)local_28);
  std::__cxx11::string::_M_assign((string *)(local_88._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_88,2);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"--order",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"test case order (defaults to decl)",&local_1a);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  std::__cxx11::string::string((string *)local_88,"decl|lex|rand",&local_19);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_a8,setOrder,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"--rng-seed",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)&local_48,"set a specific seed for random numbers",&local_1a);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  std::__cxx11::string::string((string *)local_88,"\'time\'|number",&local_19);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_a8,setRngSeed,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"--force-colour",(allocator *)local_a8);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_88,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)&local_48,"force colourised output (deprecated)",(allocator *)local_28);
  std::__cxx11::string::_M_assign((string *)(local_88._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_88,forceColour);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::string((string *)(local_88 + 0x20),"--use-colour",(allocator *)local_28);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a8,(string *)in_RDI);
  std::__cxx11::string::string((string *)&local_48,"should output be colourised",&local_1a);
  std::__cxx11::string::_M_assign((string *)(local_a8._0_8_ + 8));
  std::__cxx11::string::string((string *)local_88,"yes|no",&local_19);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_a8,setUseColour,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

		using namespace Clara;
		CommandLine<ConfigData> cli;

		cli.bindProcessName(&ConfigData::processName);

		cli["-?"]["-h"]["--help"]
			.describe("display usage information")
			.bind(&ConfigData::showHelp);

		cli["-l"]["--list-tests"]
			.describe("list all/matching test cases")
			.bind(&ConfigData::listTests);

		cli["-t"]["--list-tags"]
			.describe("list all/matching tags")
			.bind(&ConfigData::listTags);

		cli["-s"]["--success"]
			.describe("include successful tests in output")
			.bind(&ConfigData::showSuccessfulTests);

		cli["-b"]["--break"]
			.describe("break into debugger on failure")
			.bind(&ConfigData::shouldDebugBreak);

		cli["-e"]["--nothrow"]
			.describe("skip exception tests")
			.bind(&ConfigData::noThrow);

		cli["-i"]["--invisibles"]
			.describe("show invisibles (tabs, newlines)")
			.bind(&ConfigData::showInvisibles);

		cli["-o"]["--out"]
			.describe("output filename")
			.bind(&ConfigData::outputFilename, "filename");

		cli["-r"]["--reporter"]
			//            .placeholder( "name[:filename]" )
			.describe("reporter to use (defaults to console)")
			.bind(&addReporterName, "name");

		cli["-n"]["--name"]
			.describe("suite name")
			.bind(&ConfigData::name, "name");

		cli["-a"]["--abort"]
			.describe("abort at first failure")
			.bind(&abortAfterFirst);

		cli["-x"]["--abortx"]
			.describe("abort after x failures")
			.bind(&abortAfterX, "no. failures");

		cli["-w"]["--warn"]
			.describe("enable warnings")
			.bind(&addWarning, "warning name");

		// - needs updating if reinstated
		//        cli.into( &setVerbosity )
		//            .describe( "level of verbosity (0=no output)" )
		//            .shortOpt( "v")
		//            .longOpt( "verbosity" )
		//            .placeholder( "level" );

		cli[_]
			.describe("which test or tests to use")
			.bind(&addTestOrTags, "test name, pattern or tags");

		cli["-d"]["--durations"]
			.describe("show test durations")
			.bind(&setShowDurations, "yes|no");

		cli["-f"]["--input-file"]
			.describe("load test names to run from a file")
			.bind(&loadTestNamesFromFile, "filename");

		cli["-#"]["--filenames-as-tags"]
			.describe("adds a tag for the filename")
			.bind(&ConfigData::filenamesAsTags);

		// Less common commands which don't have a short form
		cli["--list-test-names-only"]
			.describe("list all/matching test cases names only")
			.bind(&ConfigData::listTestNamesOnly);

		cli["--list-reporters"]
			.describe("list all reporters")
			.bind(&ConfigData::listReporters);

		cli["--order"]
			.describe("test case order (defaults to decl)")
			.bind(&setOrder, "decl|lex|rand");

		cli["--rng-seed"]
			.describe("set a specific seed for random numbers")
			.bind(&setRngSeed, "'time'|number");

		cli["--force-colour"]
			.describe("force colourised output (deprecated)")
			.bind(&forceColour);

		cli["--use-colour"]
			.describe("should output be colourised")
			.bind(&setUseColour, "yes|no");

		return cli;
	}